

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaLib.cpp
# Opt level: O0

char * xmrig::CudaLib::version_abi_cxx11_(uint32_t version)

{
  char *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_80 [28];
  uint in_stack_ffffffffffffff9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  string local_30 [48];
  
  __lhs = local_50;
  std::__cxx11::to_string(in_stack_ffffffffffffff9c);
  std::operator+(__lhs,in_RDI);
  std::__cxx11::to_string(in_stack_ffffffffffffff9c);
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)local_50);
  return in_RDI;
}

Assistant:

std::string xmrig::CudaLib::version(uint32_t version)
{
    return std::to_string(version / 1000) + "." + std::to_string((version % 1000) / 10);
}